

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string> * __thiscall
lest::make_enum_string<nonstd::expected_lite::unexpected_type<int>>
          (ForNonEnum<nonstd::expected_lite::unexpected_type<int>,_std::string>
           *__return_storage_ptr__,lest *this,unexpected_type<int> *item)

{
  char *__rhs;
  unexpected_type<int> *item_00;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  lest *local_18;
  unexpected_type<int> *item_local;
  
  local_18 = this;
  item_local = (unexpected_type<int> *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"[type: ",&local_79);
  __rhs = std::type_info::name((type_info *)&nonstd::expected_lite::unexpected_type<int>::typeinfo);
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(&local_38,&local_58,"]: ");
  make_memory_string<nonstd::expected_lite::unexpected_type<int>>(&local_b0,local_18,item_00);
  std::operator+(__return_storage_ptr__,&local_38,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return __return_storage_ptr__;
}

Assistant:

auto make_enum_string( T const & item ) -> ForNonEnum<T, std::string>
{
#if lest__cpp_rtti
    return text("[type: ") + typeid(T).name() + "]: " + make_memory_string( item );
#else
    return text("[type: (no RTTI)]: ") + make_memory_string( item );
#endif
}